

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_set_auxdata(sqlite3_context *pCtx,int iArg,void *pAux,_func_void_void_ptr *xDelete)

{
  AuxData **ppAVar1;
  Vdbe *pVVar2;
  AuxData *pAVar3;
  AuxData **ppAVar4;
  
  pVVar2 = pCtx->pVdbe;
  if (pVVar2 != (Vdbe *)0x0) {
    ppAVar1 = &pVVar2->pAuxData;
    ppAVar4 = ppAVar1;
    while (pAVar3 = *ppAVar4, pAVar3 != (AuxData *)0x0) {
      if ((pAVar3->iAuxArg == iArg) && ((iArg < 0 || (pAVar3->iAuxOp == pCtx->iOp)))) {
        if (pAVar3->xDeleteAux != (_func_void_void_ptr *)0x0) {
          (*pAVar3->xDeleteAux)(pAVar3->pAux);
        }
        goto LAB_00120f2d;
      }
      ppAVar4 = &pAVar3->pNextAux;
    }
    pAVar3 = (AuxData *)sqlite3DbMallocZero(pVVar2->db,0x20);
    if (pAVar3 != (AuxData *)0x0) {
      pAVar3->iAuxOp = pCtx->iOp;
      pAVar3->iAuxArg = iArg;
      pAVar3->pNextAux = *ppAVar1;
      *ppAVar1 = pAVar3;
      if (pCtx->isError == 0) {
        pCtx->isError = -1;
      }
LAB_00120f2d:
      pAVar3->pAux = pAux;
      pAVar3->xDeleteAux = xDelete;
      return;
    }
  }
  if (xDelete == (_func_void_void_ptr *)0x0) {
    return;
  }
  (*xDelete)(pAux);
  return;
}

Assistant:

SQLITE_API void sqlite3_set_auxdata(
  sqlite3_context *pCtx, 
  int iArg, 
  void *pAux, 
  void (*xDelete)(void*)
){
  AuxData *pAuxData;
  Vdbe *pVdbe = pCtx->pVdbe;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( pVdbe==0 ) goto failed;
#else
  assert( pVdbe!=0 );
#endif

  for(pAuxData=pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNextAux){
    if( pAuxData->iAuxArg==iArg && (pAuxData->iAuxOp==pCtx->iOp || iArg<0) ){
      break;
    }
  }
  if( pAuxData==0 ){
    pAuxData = sqlite3DbMallocZero(pVdbe->db, sizeof(AuxData));
    if( !pAuxData ) goto failed;
    pAuxData->iAuxOp = pCtx->iOp;
    pAuxData->iAuxArg = iArg;
    pAuxData->pNextAux = pVdbe->pAuxData;
    pVdbe->pAuxData = pAuxData;
    if( pCtx->isError==0 ) pCtx->isError = -1;
  }else if( pAuxData->xDeleteAux ){
    pAuxData->xDeleteAux(pAuxData->pAux);
  }

  pAuxData->pAux = pAux;
  pAuxData->xDeleteAux = xDelete;
  return;

failed:
  if( xDelete ){
    xDelete(pAux);
  }
}